

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  ParserImpl *in_stack_00000038;
  string field_name;
  string *in_stack_fffffffffffffe28;
  ParserImpl *in_stack_fffffffffffffe30;
  string *value;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  byte bVar5;
  undefined1 in_stack_fffffffffffffe67;
  ParserImpl *in_stack_fffffffffffffe68;
  allocator *paVar6;
  undefined1 local_159 [40];
  allocator local_131;
  string *in_stack_fffffffffffffed0;
  ParserImpl *in_stack_fffffffffffffed8;
  allocator local_109;
  string local_108 [37];
  byte local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [36];
  uint local_94;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"[",&local_31);
  bVar2 = TryConsume((ParserImpl *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (string *)in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar2) {
    bVar2 = ConsumeTypeUrlOrFullTypeName(in_stack_fffffffffffffed8);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_007174ee;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"]",&local_69);
    bVar2 = Consume(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_007174ee;
    }
  }
  else {
    std::__cxx11::string::string(local_90);
    bVar2 = ConsumeIdentifier(in_stack_fffffffffffffe68,
                              (string *)
                              CONCAT17(in_stack_fffffffffffffe67,
                                       CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)
                                      ));
    if (!bVar2) {
      local_1 = 0;
    }
    local_94 = (uint)!bVar2;
    std::__cxx11::string::~string(local_90);
    if (local_94 != 0) goto LAB_007174ee;
  }
  paVar6 = &local_b9;
  std::allocator<char>::allocator();
  local_e2 = 0;
  local_e3 = 0;
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string(local_b8,":",paVar6);
  bVar3 = TryConsume((ParserImpl *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (string *)in_stack_fffffffffffffe30);
  bVar5 = 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string(local_e0,"{",&local_e1);
    local_e3 = 1;
    bVar3 = LookingAt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    bVar5 = 0;
    if (!bVar3) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string(local_108,"<",&local_109);
      bVar2 = true;
      bVar3 = LookingAt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      bVar5 = bVar3 ^ 0xff;
    }
  }
  if (bVar2) {
    std::__cxx11::string::~string(local_108);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if ((local_e3 & 1) != 0) {
    std::__cxx11::string::~string(local_e0);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if ((bVar5 & 1) == 0) {
    bVar2 = SkipFieldMessage(in_stack_fffffffffffffed8);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_007174ee;
    }
  }
  else {
    bVar2 = SkipFieldValue(in_stack_00000038);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_007174ee;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffed0,";",&local_131);
  uVar4 = TryConsume((ParserImpl *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (string *)in_stack_fffffffffffffe30);
  if (!(bool)uVar4) {
    value = (string *)local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_159 + 1),",",(allocator *)value);
    TryConsume((ParserImpl *)CONCAT17(uVar4,in_stack_fffffffffffffe38),value);
    std::__cxx11::string::~string((string *)(local_159 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_159);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_1 = 1;
LAB_007174ee:
  return (bool)(local_1 & 1);
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }